

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkGear.cpp
# Opt level: O2

void __thiscall chrono::ChLinkGear::ChLinkGear(ChLinkGear *this)

{
  double dVar1;
  ChVector<double> local_58;
  ChQuaternion<double> local_40;
  
  ChLinkLock::ChLinkLock(&this->super_ChLinkLock);
  (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.
  super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChLinkGear_011657b8;
  this->tau = 1.0;
  this->alpha = 0.0;
  this->beta = 0.0;
  *(undefined8 *)((long)&this->beta + 2) = 0;
  *(undefined8 *)((long)&this->phase + 2) = 0;
  this->a1 = 0.0;
  this->a2 = 0.0;
  this->r1 = 0.0;
  this->r2 = 0.0;
  dVar1 = DAT_011dd3e0;
  (this->contact_pt).m_data[0] = VNULL;
  (this->contact_pt).m_data[1] = dVar1;
  (this->contact_pt).m_data[2] = DAT_011dd3e8;
  local_40.m_data[0] = 1.0;
  local_58.m_data[2] = 0.0;
  local_40.m_data[3] = 0.0;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  local_40.m_data[1] = 0.0;
  local_40.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(&this->local_shaft1,&local_58,&local_40);
  local_40.m_data[0] = 1.0;
  local_58.m_data[2] = 0.0;
  local_40.m_data[3] = 0.0;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  local_40.m_data[1] = 0.0;
  local_40.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(&this->local_shaft2,&local_58,&local_40);
  ChFrame<double>::SetIdentity(&this->local_shaft1);
  ChFrame<double>::SetIdentity(&this->local_shaft2);
  ChLinkMaskLF::SetLockMask(&(this->super_ChLinkLock).mask,true,false,false,false,false,false,false)
  ;
  ChLinkLock::BuildLink(&this->super_ChLinkLock);
  return;
}

Assistant:

ChLinkGear::ChLinkGear()
    : tau(1),
      alpha(0),
      beta(0),
      phase(0),
      checkphase(false),
      epicyclic(false),
      a1(0),
      a2(0),
      r1(0),
      r2(0),
      contact_pt(VNULL) {
    local_shaft1.SetIdentity();
    local_shaft2.SetIdentity();

    // Mask: initialize our LinkMaskLF (lock formulation mask) to X  only
    mask.SetLockMask(true, false, false, false, false, false, false);
    BuildLink();
}